

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  Ref<embree::Geometry> *pRVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined4 uVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float fVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 (*pauVar59) [16];
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  byte bVar67;
  int iVar68;
  uint uVar69;
  uint uVar70;
  long lVar71;
  ulong uVar72;
  ulong uVar73;
  undefined1 (*pauVar74) [16];
  ulong uVar75;
  ulong uVar76;
  uint uVar77;
  size_t i;
  long lVar78;
  ulong uVar79;
  ulong uVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  float fVar85;
  undefined1 auVar86 [16];
  float fVar92;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar97;
  float fVar98;
  undefined1 auVar89 [32];
  float fVar93;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar99;
  float fVar105;
  float fVar106;
  vint4 bi;
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar101 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar103 [32];
  float fVar107;
  undefined1 auVar104 [32];
  float fVar111;
  float fVar119;
  float fVar120;
  vint4 ai;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar121;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar128;
  float fVar133;
  float fVar134;
  undefined1 auVar129 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar130 [32];
  float fVar135;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar139;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar149;
  float fVar154;
  uint uVar155;
  undefined1 auVar150 [16];
  float fVar152;
  float fVar153;
  float fVar156;
  uint uVar157;
  float fVar158;
  uint uVar159;
  float fVar160;
  uint uVar161;
  undefined1 auVar151 [32];
  uint uVar162;
  vint4 bi_1;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 auVar166 [16];
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  float local_1320;
  float fStack_131c;
  float fStack_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  undefined1 local_1300 [32];
  undefined1 local_12e0 [8];
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  undefined4 uStack_12c4;
  undefined1 local_12c0 [32];
  float fStack_1264;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  undefined4 uStack_10e4;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  undefined4 uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  undefined4 uStack_fe4;
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar74 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar81._4_4_ = uVar2;
  auVar81._0_4_ = uVar2;
  auVar81._8_4_ = uVar2;
  auVar81._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar82._4_4_ = uVar2;
  auVar82._0_4_ = uVar2;
  auVar82._8_4_ = uVar2;
  auVar82._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar83._4_4_ = uVar2;
  auVar83._0_4_ = uVar2;
  auVar83._8_4_ = uVar2;
  auVar83._12_4_ = uVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar73 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar75 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar76 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar68 = (tray->tfar).field_0.i[k];
  auVar165 = ZEXT1664(CONCAT412(iVar68,CONCAT48(iVar68,CONCAT44(iVar68,iVar68))));
  iVar68 = (tray->tnear).field_0.i[k];
  auVar166._4_4_ = iVar68;
  auVar166._0_4_ = iVar68;
  auVar166._8_4_ = iVar68;
  auVar166._12_4_ = iVar68;
  local_12c0._16_16_ = mm_lookupmask_ps._240_16_;
  local_12c0._0_16_ = mm_lookupmask_ps._0_16_;
  auVar118._8_4_ = 0x3f800000;
  auVar118._0_8_ = 0x3f8000003f800000;
  auVar118._12_4_ = 0x3f800000;
  auVar118._16_4_ = 0x3f800000;
  auVar118._20_4_ = 0x3f800000;
  auVar118._24_4_ = 0x3f800000;
  auVar118._28_4_ = 0x3f800000;
  auVar87._8_4_ = 0xbf800000;
  auVar87._0_8_ = 0xbf800000bf800000;
  auVar87._12_4_ = 0xbf800000;
  auVar87._16_4_ = 0xbf800000;
  auVar87._20_4_ = 0xbf800000;
  auVar87._24_4_ = 0xbf800000;
  auVar87._28_4_ = 0xbf800000;
  _local_12e0 = vblendvps_avx(auVar118,auVar87,local_12c0);
LAB_00ef65ea:
  do {
    do {
      if (pauVar74 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar59 = pauVar74 + -1;
      pauVar74 = pauVar74 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar59 + 8));
    uVar79 = *(ulong *)*pauVar74;
    while ((uVar79 & 8) == 0) {
      auVar86 = vsubps_avx(*(undefined1 (*) [16])(uVar79 + 0x20 + uVar73),auVar81);
      auVar150._0_4_ = fVar3 * auVar86._0_4_;
      auVar150._4_4_ = fVar3 * auVar86._4_4_;
      auVar150._8_4_ = fVar3 * auVar86._8_4_;
      auVar150._12_4_ = fVar3 * auVar86._12_4_;
      auVar86 = vsubps_avx(*(undefined1 (*) [16])(uVar79 + 0x20 + uVar75),auVar82);
      auVar102._0_4_ = auVar86._0_4_ * fVar4;
      auVar102._4_4_ = auVar86._4_4_ * fVar4;
      auVar102._8_4_ = auVar86._8_4_ * fVar4;
      auVar102._12_4_ = auVar86._12_4_ * fVar4;
      auVar86 = vpmaxsd_avx(auVar150,auVar102);
      auVar150 = vsubps_avx(*(undefined1 (*) [16])(uVar79 + 0x20 + uVar76),auVar83);
      auVar125._0_4_ = auVar150._0_4_ * fVar5;
      auVar125._4_4_ = auVar150._4_4_ * fVar5;
      auVar125._8_4_ = auVar150._8_4_ * fVar5;
      auVar125._12_4_ = auVar150._12_4_ * fVar5;
      auVar150 = vpmaxsd_avx(auVar125,auVar166);
      auVar150 = vpmaxsd_avx(auVar86,auVar150);
      auVar86 = vsubps_avx(*(undefined1 (*) [16])(uVar79 + 0x20 + (uVar73 ^ 0x10)),auVar81);
      auVar100._0_4_ = auVar86._0_4_ * fVar3;
      auVar100._4_4_ = auVar86._4_4_ * fVar3;
      auVar100._8_4_ = auVar86._8_4_ * fVar3;
      auVar100._12_4_ = auVar86._12_4_ * fVar3;
      auVar86 = vsubps_avx(*(undefined1 (*) [16])(uVar79 + 0x20 + (uVar75 ^ 0x10)),auVar82);
      auVar112._0_4_ = auVar86._0_4_ * fVar4;
      auVar112._4_4_ = auVar86._4_4_ * fVar4;
      auVar112._8_4_ = auVar86._8_4_ * fVar4;
      auVar112._12_4_ = auVar86._12_4_ * fVar4;
      auVar86 = vpminsd_avx(auVar100,auVar112);
      auVar102 = vsubps_avx(*(undefined1 (*) [16])(uVar79 + 0x20 + (uVar76 ^ 0x10)),auVar83);
      auVar113._0_4_ = auVar102._0_4_ * fVar5;
      auVar113._4_4_ = auVar102._4_4_ * fVar5;
      auVar113._8_4_ = auVar102._8_4_ * fVar5;
      auVar113._12_4_ = auVar102._12_4_ * fVar5;
      auVar102 = vpminsd_avx(auVar113,auVar165._0_16_);
      auVar86 = vpminsd_avx(auVar86,auVar102);
      auVar86 = vpcmpgtd_avx(auVar150,auVar86);
      iVar68 = vmovmskps_avx(auVar86);
      local_1180._0_16_ = auVar150;
      if (iVar68 == 0xf) goto LAB_00ef65ea;
      bVar67 = (byte)iVar68 ^ 0xf;
      uVar80 = uVar79 & 0xfffffffffffffff0;
      lVar78 = 0;
      if (bVar67 != 0) {
        for (; (bVar67 >> lVar78 & 1) == 0; lVar78 = lVar78 + 1) {
        }
      }
      uVar79 = *(ulong *)(uVar80 + lVar78 * 8);
      uVar77 = bVar67 - 1 & (uint)bVar67;
      if (uVar77 != 0) {
        uVar69 = *(uint *)(local_1180 + lVar78 * 4);
        lVar78 = 0;
        if (uVar77 != 0) {
          for (; (uVar77 >> lVar78 & 1) == 0; lVar78 = lVar78 + 1) {
          }
        }
        uVar72 = *(ulong *)(uVar80 + lVar78 * 8);
        uVar70 = *(uint *)(local_1180 + lVar78 * 4);
        uVar77 = uVar77 - 1 & uVar77;
        if (uVar77 == 0) {
          if (uVar69 < uVar70) {
            *(ulong *)*pauVar74 = uVar72;
            *(uint *)(*pauVar74 + 8) = uVar70;
            pauVar74 = pauVar74 + 1;
          }
          else {
            *(ulong *)*pauVar74 = uVar79;
            *(uint *)(*pauVar74 + 8) = uVar69;
            pauVar74 = pauVar74 + 1;
            uVar79 = uVar72;
          }
        }
        else {
          auVar86._8_8_ = 0;
          auVar86._0_8_ = uVar79;
          auVar86 = vpunpcklqdq_avx(auVar86,ZEXT416(uVar69));
          auVar101._8_8_ = 0;
          auVar101._0_8_ = uVar72;
          auVar150 = vpunpcklqdq_avx(auVar101,ZEXT416(uVar70));
          lVar78 = 0;
          if (uVar77 != 0) {
            for (; (uVar77 >> lVar78 & 1) == 0; lVar78 = lVar78 + 1) {
            }
          }
          auVar114._8_8_ = 0;
          auVar114._0_8_ = *(ulong *)(uVar80 + lVar78 * 8);
          auVar125 = vpunpcklqdq_avx(auVar114,ZEXT416(*(uint *)(local_1180 + lVar78 * 4)));
          auVar102 = vpcmpgtd_avx(auVar150,auVar86);
          uVar77 = uVar77 - 1 & uVar77;
          if (uVar77 == 0) {
            auVar100 = vpshufd_avx(auVar102,0xaa);
            auVar102 = vblendvps_avx(auVar150,auVar86,auVar100);
            auVar86 = vblendvps_avx(auVar86,auVar150,auVar100);
            auVar150 = vpcmpgtd_avx(auVar125,auVar102);
            auVar100 = vpshufd_avx(auVar150,0xaa);
            auVar150 = vblendvps_avx(auVar125,auVar102,auVar100);
            auVar102 = vblendvps_avx(auVar102,auVar125,auVar100);
            auVar125 = vpcmpgtd_avx(auVar102,auVar86);
            auVar100 = vpshufd_avx(auVar125,0xaa);
            auVar125 = vblendvps_avx(auVar102,auVar86,auVar100);
            auVar86 = vblendvps_avx(auVar86,auVar102,auVar100);
            *pauVar74 = auVar86;
            pauVar74[1] = auVar125;
            uVar79 = auVar150._0_8_;
            pauVar74 = pauVar74 + 2;
          }
          else {
            lVar78 = 0;
            if (uVar77 != 0) {
              for (; (uVar77 >> lVar78 & 1) == 0; lVar78 = lVar78 + 1) {
              }
            }
            auVar129._8_8_ = 0;
            auVar129._0_8_ = *(ulong *)(uVar80 + lVar78 * 8);
            auVar112 = vpunpcklqdq_avx(auVar129,ZEXT416(*(uint *)(local_1180 + lVar78 * 4)));
            auVar100 = vpshufd_avx(auVar102,0xaa);
            auVar102 = vblendvps_avx(auVar150,auVar86,auVar100);
            auVar86 = vblendvps_avx(auVar86,auVar150,auVar100);
            auVar150 = vpcmpgtd_avx(auVar112,auVar125);
            auVar100 = vpshufd_avx(auVar150,0xaa);
            auVar150 = vblendvps_avx(auVar112,auVar125,auVar100);
            auVar125 = vblendvps_avx(auVar125,auVar112,auVar100);
            auVar100 = vpcmpgtd_avx(auVar125,auVar86);
            auVar112 = vpshufd_avx(auVar100,0xaa);
            auVar100 = vblendvps_avx(auVar125,auVar86,auVar112);
            auVar86 = vblendvps_avx(auVar86,auVar125,auVar112);
            auVar125 = vpcmpgtd_avx(auVar150,auVar102);
            auVar112 = vpshufd_avx(auVar125,0xaa);
            auVar125 = vblendvps_avx(auVar150,auVar102,auVar112);
            auVar150 = vblendvps_avx(auVar102,auVar150,auVar112);
            auVar102 = vpcmpgtd_avx(auVar100,auVar150);
            auVar112 = vpshufd_avx(auVar102,0xaa);
            auVar102 = vblendvps_avx(auVar100,auVar150,auVar112);
            auVar150 = vblendvps_avx(auVar150,auVar100,auVar112);
            *pauVar74 = auVar86;
            pauVar74[1] = auVar150;
            pauVar74[2] = auVar102;
            uVar79 = auVar125._0_8_;
            pauVar74 = pauVar74 + 3;
          }
        }
      }
    }
    uVar80 = uVar79 & 0xfffffffffffffff0;
    for (lVar78 = 0; lVar78 != (ulong)((uint)uVar79 & 0xf) - 8; lVar78 = lVar78 + 1) {
      lVar71 = lVar78 * 0xe0;
      lVar1 = uVar80 + 0xd0 + lVar71;
      local_11c0 = *(undefined8 *)(lVar1 + 0x10);
      uStack_11b8 = *(undefined8 *)(lVar1 + 0x18);
      lVar1 = uVar80 + 0xc0 + lVar71;
      local_11a0 = *(undefined8 *)(lVar1 + 0x10);
      uStack_1198 = *(undefined8 *)(lVar1 + 0x18);
      uStack_1190 = local_11a0;
      uStack_1188 = uStack_1198;
      uStack_11b0 = local_11c0;
      uStack_11a8 = uStack_11b8;
      auVar88._16_16_ = *(undefined1 (*) [16])(uVar80 + 0x60 + lVar71);
      auVar88._0_16_ = *(undefined1 (*) [16])(uVar80 + lVar71);
      auVar115._16_16_ = *(undefined1 (*) [16])(uVar80 + 0x70 + lVar71);
      auVar115._0_16_ = *(undefined1 (*) [16])(uVar80 + 0x10 + lVar71);
      auVar126._16_16_ = *(undefined1 (*) [16])(uVar80 + 0x80 + lVar71);
      auVar126._0_16_ = *(undefined1 (*) [16])(uVar80 + 0x20 + lVar71);
      auVar86 = *(undefined1 (*) [16])(uVar80 + 0x30 + lVar71);
      auVar103._16_16_ = auVar86;
      auVar103._0_16_ = auVar86;
      auVar86 = *(undefined1 (*) [16])(uVar80 + 0x40 + lVar71);
      auVar130._16_16_ = auVar86;
      auVar130._0_16_ = auVar86;
      auVar86 = *(undefined1 (*) [16])(uVar80 + 0x50 + lVar71);
      auVar140._16_16_ = auVar86;
      auVar140._0_16_ = auVar86;
      auVar86 = *(undefined1 (*) [16])(uVar80 + 0x90 + lVar71);
      auVar151._16_16_ = auVar86;
      auVar151._0_16_ = auVar86;
      auVar86 = *(undefined1 (*) [16])(uVar80 + 0xa0 + lVar71);
      auVar84._16_16_ = auVar86;
      auVar84._0_16_ = auVar86;
      auVar86 = *(undefined1 (*) [16])(uVar80 + 0xb0 + lVar71);
      auVar163._16_16_ = auVar86;
      auVar163._0_16_ = auVar86;
      auVar87 = vsubps_avx(auVar88,auVar103);
      auVar118 = vsubps_avx(auVar115,auVar130);
      auVar103 = vsubps_avx(auVar126,auVar140);
      auVar39 = vsubps_avx(auVar151,auVar88);
      auVar40 = vsubps_avx(auVar84,auVar115);
      auVar41 = vsubps_avx(auVar163,auVar126);
      fVar94 = auVar41._0_4_;
      fVar128 = auVar118._0_4_;
      fVar92 = auVar41._4_4_;
      fVar133 = auVar118._4_4_;
      auVar42._4_4_ = fVar133 * fVar92;
      auVar42._0_4_ = fVar128 * fVar94;
      fVar14 = auVar41._8_4_;
      fVar134 = auVar118._8_4_;
      auVar42._8_4_ = fVar134 * fVar14;
      fVar19 = auVar41._12_4_;
      fVar135 = auVar118._12_4_;
      auVar42._12_4_ = fVar135 * fVar19;
      fVar24 = auVar41._16_4_;
      fVar136 = auVar118._16_4_;
      auVar42._16_4_ = fVar136 * fVar24;
      fVar29 = auVar41._20_4_;
      fVar137 = auVar118._20_4_;
      auVar42._20_4_ = fVar137 * fVar29;
      fVar34 = auVar41._24_4_;
      fVar138 = auVar118._24_4_;
      uVar45 = auVar86._12_4_;
      auVar42._24_4_ = fVar138 * fVar34;
      auVar42._28_4_ = uVar45;
      fVar95 = auVar40._0_4_;
      fVar139 = auVar103._0_4_;
      fVar10 = auVar40._4_4_;
      fVar143 = auVar103._4_4_;
      auVar41._4_4_ = fVar143 * fVar10;
      auVar41._0_4_ = fVar139 * fVar95;
      fVar15 = auVar40._8_4_;
      fVar144 = auVar103._8_4_;
      auVar41._8_4_ = fVar144 * fVar15;
      fVar20 = auVar40._12_4_;
      fVar145 = auVar103._12_4_;
      auVar41._12_4_ = fVar145 * fVar20;
      fVar25 = auVar40._16_4_;
      fVar146 = auVar103._16_4_;
      auVar41._16_4_ = fVar146 * fVar25;
      fVar30 = auVar40._20_4_;
      fVar147 = auVar103._20_4_;
      auVar41._20_4_ = fVar147 * fVar30;
      fVar35 = auVar40._24_4_;
      fVar148 = auVar103._24_4_;
      auVar41._24_4_ = fVar148 * fVar35;
      auVar41._28_4_ = auVar118._28_4_;
      auVar103 = vsubps_avx(auVar41,auVar42);
      fVar96 = auVar39._0_4_;
      fVar11 = auVar39._4_4_;
      auVar43._4_4_ = fVar143 * fVar11;
      auVar43._0_4_ = fVar139 * fVar96;
      fVar16 = auVar39._8_4_;
      auVar43._8_4_ = fVar144 * fVar16;
      fVar21 = auVar39._12_4_;
      auVar43._12_4_ = fVar145 * fVar21;
      fVar26 = auVar39._16_4_;
      auVar43._16_4_ = fVar146 * fVar26;
      fVar31 = auVar39._20_4_;
      auVar43._20_4_ = fVar147 * fVar31;
      fVar36 = auVar39._24_4_;
      auVar43._24_4_ = fVar148 * fVar36;
      auVar43._28_4_ = auVar103._28_4_;
      fVar99 = auVar87._0_4_;
      fVar105 = auVar87._4_4_;
      auVar39._4_4_ = fVar105 * fVar92;
      auVar39._0_4_ = fVar99 * fVar94;
      fVar106 = auVar87._8_4_;
      auVar39._8_4_ = fVar106 * fVar14;
      fVar107 = auVar87._12_4_;
      auVar39._12_4_ = fVar107 * fVar19;
      fVar108 = auVar87._16_4_;
      auVar39._16_4_ = fVar108 * fVar24;
      fVar109 = auVar87._20_4_;
      auVar39._20_4_ = fVar109 * fVar29;
      fVar110 = auVar87._24_4_;
      auVar39._24_4_ = fVar110 * fVar34;
      auVar39._28_4_ = uVar45;
      auVar39 = vsubps_avx(auVar39,auVar43);
      auVar44._4_4_ = fVar105 * fVar10;
      auVar44._0_4_ = fVar99 * fVar95;
      auVar44._8_4_ = fVar106 * fVar15;
      auVar44._12_4_ = fVar107 * fVar20;
      auVar44._16_4_ = fVar108 * fVar25;
      auVar44._20_4_ = fVar109 * fVar30;
      auVar44._24_4_ = fVar110 * fVar35;
      auVar44._28_4_ = auVar40._28_4_;
      auVar40._4_4_ = fVar133 * fVar11;
      auVar40._0_4_ = fVar128 * fVar96;
      auVar40._8_4_ = fVar134 * fVar16;
      auVar40._12_4_ = fVar135 * fVar21;
      auVar40._16_4_ = fVar136 * fVar26;
      auVar40._20_4_ = fVar137 * fVar31;
      auVar40._24_4_ = fVar138 * fVar36;
      auVar40._28_4_ = uVar45;
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar131._4_4_ = uVar2;
      auVar131._0_4_ = uVar2;
      auVar131._8_4_ = uVar2;
      auVar131._12_4_ = uVar2;
      auVar131._16_4_ = uVar2;
      auVar131._20_4_ = uVar2;
      auVar131._24_4_ = uVar2;
      auVar131._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar141._4_4_ = uVar2;
      auVar141._0_4_ = uVar2;
      auVar141._8_4_ = uVar2;
      auVar141._12_4_ = uVar2;
      auVar141._16_4_ = uVar2;
      auVar141._20_4_ = uVar2;
      auVar141._24_4_ = uVar2;
      auVar141._28_4_ = uVar2;
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar116._4_4_ = uVar6;
      auVar116._0_4_ = uVar6;
      auVar116._8_4_ = uVar6;
      auVar116._12_4_ = uVar6;
      auVar116._16_4_ = uVar6;
      auVar116._20_4_ = uVar6;
      auVar116._24_4_ = uVar6;
      auVar116._28_4_ = uVar6;
      fVar85 = *(float *)(ray + k * 4 + 0x50);
      auVar40 = vsubps_avx(auVar40,auVar44);
      auVar41 = vsubps_avx(auVar88,auVar131);
      fVar98 = *(float *)(ray + k * 4 + 0x60);
      auVar42 = vsubps_avx(auVar115,auVar141);
      auVar87 = vsubps_avx(auVar126,auVar116);
      fVar111 = auVar87._0_4_;
      fVar119 = auVar87._4_4_;
      auVar46._4_4_ = fVar119 * fVar85;
      auVar46._0_4_ = fVar111 * fVar85;
      fVar120 = auVar87._8_4_;
      auVar46._8_4_ = fVar120 * fVar85;
      fVar121 = auVar87._12_4_;
      auVar46._12_4_ = fVar121 * fVar85;
      fVar122 = auVar87._16_4_;
      auVar46._16_4_ = fVar122 * fVar85;
      fVar123 = auVar87._20_4_;
      auVar46._20_4_ = fVar123 * fVar85;
      fVar124 = auVar87._24_4_;
      auVar46._24_4_ = fVar124 * fVar85;
      auVar46._28_4_ = uVar2;
      fVar8 = auVar42._0_4_;
      fVar12 = auVar42._4_4_;
      auVar47._4_4_ = fVar98 * fVar12;
      auVar47._0_4_ = fVar98 * fVar8;
      fVar17 = auVar42._8_4_;
      auVar47._8_4_ = fVar98 * fVar17;
      fVar22 = auVar42._12_4_;
      auVar47._12_4_ = fVar98 * fVar22;
      fVar27 = auVar42._16_4_;
      auVar47._16_4_ = fVar98 * fVar27;
      fVar32 = auVar42._20_4_;
      auVar47._20_4_ = fVar98 * fVar32;
      fVar37 = auVar42._24_4_;
      auVar47._24_4_ = fVar98 * fVar37;
      auVar47._28_4_ = uVar45;
      auVar118 = vsubps_avx(auVar47,auVar46);
      fVar93 = *(float *)(ray + k * 4 + 0x40);
      fVar9 = auVar41._0_4_;
      fVar13 = auVar41._4_4_;
      auVar49._4_4_ = fVar98 * fVar13;
      auVar49._0_4_ = fVar98 * fVar9;
      fVar18 = auVar41._8_4_;
      auVar49._8_4_ = fVar98 * fVar18;
      fVar23 = auVar41._12_4_;
      auVar49._12_4_ = fVar98 * fVar23;
      fVar28 = auVar41._16_4_;
      auVar49._16_4_ = fVar98 * fVar28;
      fVar33 = auVar41._20_4_;
      auVar49._20_4_ = fVar98 * fVar33;
      fVar38 = auVar41._24_4_;
      fVar48 = auVar118._28_4_;
      auVar49._24_4_ = fVar98 * fVar38;
      auVar49._28_4_ = fVar48;
      auVar50._4_4_ = fVar119 * fVar93;
      auVar50._0_4_ = fVar111 * fVar93;
      auVar50._8_4_ = fVar120 * fVar93;
      auVar50._12_4_ = fVar121 * fVar93;
      auVar50._16_4_ = fVar122 * fVar93;
      auVar50._20_4_ = fVar123 * fVar93;
      auVar50._24_4_ = fVar124 * fVar93;
      auVar50._28_4_ = auVar87._28_4_;
      auVar43 = vsubps_avx(auVar50,auVar49);
      auVar51._4_4_ = fVar93 * fVar12;
      auVar51._0_4_ = fVar93 * fVar8;
      auVar51._8_4_ = fVar93 * fVar17;
      auVar51._12_4_ = fVar93 * fVar22;
      auVar51._16_4_ = fVar93 * fVar27;
      auVar51._20_4_ = fVar93 * fVar32;
      auVar51._24_4_ = fVar93 * fVar37;
      auVar51._28_4_ = auVar87._28_4_;
      auVar52._4_4_ = fVar85 * fVar13;
      auVar52._0_4_ = fVar85 * fVar9;
      auVar52._8_4_ = fVar85 * fVar18;
      auVar52._12_4_ = fVar85 * fVar23;
      auVar52._16_4_ = fVar85 * fVar28;
      auVar52._20_4_ = fVar85 * fVar33;
      auVar52._24_4_ = fVar85 * fVar38;
      auVar52._28_4_ = fVar48;
      auVar44 = vsubps_avx(auVar52,auVar51);
      fVar149 = auVar40._0_4_;
      fVar152 = auVar40._4_4_;
      fVar153 = auVar40._8_4_;
      fVar154 = auVar40._12_4_;
      fVar156 = auVar40._16_4_;
      fVar158 = auVar40._20_4_;
      fVar160 = auVar40._24_4_;
      local_13c0._0_4_ = auVar39._0_4_;
      fVar60 = (float)local_13c0;
      local_13c0._4_4_ = auVar39._4_4_;
      fVar61 = local_13c0._4_4_;
      uStack_13b8._0_4_ = auVar39._8_4_;
      fVar62 = (float)uStack_13b8;
      uStack_13b8._4_4_ = auVar39._12_4_;
      fVar63 = uStack_13b8._4_4_;
      uStack_13b0._0_4_ = auVar39._16_4_;
      fVar64 = (float)uStack_13b0;
      uStack_13b0._4_4_ = auVar39._20_4_;
      fVar65 = uStack_13b0._4_4_;
      uStack_13a8._0_4_ = auVar39._24_4_;
      fVar66 = (float)uStack_13a8;
      fVar97 = fVar48 + auVar41._28_4_;
      local_1380 = auVar103._0_4_;
      fStack_137c = auVar103._4_4_;
      fStack_1378 = auVar103._8_4_;
      fStack_1374 = auVar103._12_4_;
      fStack_1370 = auVar103._16_4_;
      fStack_136c = auVar103._20_4_;
      fStack_1368 = auVar103._24_4_;
      auVar127._0_4_ = fVar93 * local_1380 + fVar149 * fVar98 + fVar85 * (float)local_13c0;
      auVar127._4_4_ = fVar93 * fStack_137c + fVar152 * fVar98 + fVar85 * local_13c0._4_4_;
      auVar127._8_4_ = fVar93 * fStack_1378 + fVar153 * fVar98 + fVar85 * (float)uStack_13b8;
      auVar127._12_4_ = fVar93 * fStack_1374 + fVar154 * fVar98 + fVar85 * uStack_13b8._4_4_;
      auVar127._16_4_ = fVar93 * fStack_1370 + fVar156 * fVar98 + fVar85 * (float)uStack_13b0;
      auVar127._20_4_ = fVar93 * fStack_136c + fVar158 * fVar98 + fVar85 * uStack_13b0._4_4_;
      auVar127._24_4_ = fVar93 * fStack_1368 + fVar160 * fVar98 + fVar85 * (float)uStack_13a8;
      auVar127._28_4_ = fVar48 + fVar97;
      local_1320 = auVar118._0_4_;
      fStack_131c = auVar118._4_4_;
      fStack_1318 = auVar118._8_4_;
      fStack_1314 = auVar118._12_4_;
      fStack_1310 = auVar118._16_4_;
      fStack_130c = auVar118._20_4_;
      fStack_1308 = auVar118._24_4_;
      fVar98 = fVar98 + fVar98 + fVar97;
      auVar117._8_4_ = 0x80000000;
      auVar117._0_8_ = 0x8000000080000000;
      auVar117._12_4_ = 0x80000000;
      auVar117._16_4_ = 0x80000000;
      auVar117._20_4_ = 0x80000000;
      auVar117._24_4_ = 0x80000000;
      auVar117._28_4_ = 0x80000000;
      auVar87 = vandps_avx(auVar127,auVar117);
      uVar77 = auVar87._0_4_;
      auVar142._0_4_ =
           (float)(uVar77 ^ (uint)(local_1320 * fVar96 +
                                  auVar43._0_4_ * fVar95 + auVar44._0_4_ * fVar94));
      uVar69 = auVar87._4_4_;
      auVar142._4_4_ =
           (float)(uVar69 ^ (uint)(fStack_131c * fVar11 +
                                  auVar43._4_4_ * fVar10 + auVar44._4_4_ * fVar92));
      uVar70 = auVar87._8_4_;
      auVar142._8_4_ =
           (float)(uVar70 ^ (uint)(fStack_1318 * fVar16 +
                                  auVar43._8_4_ * fVar15 + auVar44._8_4_ * fVar14));
      uVar155 = auVar87._12_4_;
      auVar142._12_4_ =
           (float)(uVar155 ^
                  (uint)(fStack_1314 * fVar21 + auVar43._12_4_ * fVar20 + auVar44._12_4_ * fVar19));
      uVar157 = auVar87._16_4_;
      auVar142._16_4_ =
           (float)(uVar157 ^
                  (uint)(fStack_1310 * fVar26 + auVar43._16_4_ * fVar25 + auVar44._16_4_ * fVar24));
      uVar159 = auVar87._20_4_;
      auVar142._20_4_ =
           (float)(uVar159 ^
                  (uint)(fStack_130c * fVar31 + auVar43._20_4_ * fVar30 + auVar44._20_4_ * fVar29));
      uVar161 = auVar87._24_4_;
      auVar142._24_4_ =
           (float)(uVar161 ^
                  (uint)(fStack_1308 * fVar36 + auVar43._24_4_ * fVar35 + auVar44._24_4_ * fVar34));
      uVar162 = auVar87._28_4_;
      auVar142._28_4_ = (float)(uVar162 ^ (uint)fVar98);
      local_1160._0_4_ =
           (float)(uVar77 ^ (uint)(auVar44._0_4_ * fVar139 + auVar43._0_4_ * fVar128 +
                                  local_1320 * fVar99));
      local_1160._4_4_ =
           (float)(uVar69 ^ (uint)(auVar44._4_4_ * fVar143 + auVar43._4_4_ * fVar133 +
                                  fStack_131c * fVar105));
      local_1160._8_4_ =
           (float)(uVar70 ^ (uint)(auVar44._8_4_ * fVar144 + auVar43._8_4_ * fVar134 +
                                  fStack_1318 * fVar106));
      local_1160._12_4_ =
           (float)(uVar155 ^
                  (uint)(auVar44._12_4_ * fVar145 + auVar43._12_4_ * fVar135 + fStack_1314 * fVar107
                        ));
      local_1160._16_4_ =
           (float)(uVar157 ^
                  (uint)(auVar44._16_4_ * fVar146 + auVar43._16_4_ * fVar136 + fStack_1310 * fVar108
                        ));
      local_1160._20_4_ =
           (float)(uVar159 ^
                  (uint)(auVar44._20_4_ * fVar147 + auVar43._20_4_ * fVar137 + fStack_130c * fVar109
                        ));
      local_1160._24_4_ =
           (float)(uVar161 ^
                  (uint)(auVar44._24_4_ * fVar148 + auVar43._24_4_ * fVar138 + fStack_1308 * fVar110
                        ));
      local_1160._28_4_ = (float)(uVar162 ^ (uint)(auVar44._28_4_ + fVar85 + fVar98));
      auVar118 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar87 = vcmpps_avx(auVar142,auVar118,5);
      auVar118 = vcmpps_avx(local_1160,auVar118,5);
      auVar87 = vandps_avx(auVar118,auVar87);
      auVar89._8_4_ = 0x7fffffff;
      auVar89._0_8_ = 0x7fffffff7fffffff;
      auVar89._12_4_ = 0x7fffffff;
      auVar89._16_4_ = 0x7fffffff;
      auVar89._20_4_ = 0x7fffffff;
      auVar89._24_4_ = 0x7fffffff;
      auVar89._28_4_ = 0x7fffffff;
      local_1120 = vandps_avx(auVar127,auVar89);
      auVar118 = vcmpps_avx(auVar127,ZEXT1232(ZEXT812(0)) << 0x20,4);
      auVar87 = vandps_avx(auVar87,auVar118);
      auVar104._0_4_ = auVar142._0_4_ + local_1160._0_4_;
      auVar104._4_4_ = auVar142._4_4_ + local_1160._4_4_;
      auVar104._8_4_ = auVar142._8_4_ + local_1160._8_4_;
      auVar104._12_4_ = auVar142._12_4_ + local_1160._12_4_;
      auVar104._16_4_ = auVar142._16_4_ + local_1160._16_4_;
      auVar104._20_4_ = auVar142._20_4_ + local_1160._20_4_;
      auVar104._24_4_ = auVar142._24_4_ + local_1160._24_4_;
      auVar104._28_4_ = auVar142._28_4_ + local_1160._28_4_;
      auVar118 = vcmpps_avx(auVar104,local_1120,2);
      auVar43 = auVar118 & auVar87;
      if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar43 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar43 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar43 >> 0x7f,0) != '\0') ||
            (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar43 >> 0xbf,0) != '\0') ||
          (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar43[0x1f] < '\0') {
        auVar87 = vandps_avx(auVar87,auVar118);
        auVar86 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
        fStack_1264 = auVar42._28_4_;
        local_1140._0_4_ =
             (float)(uVar77 ^ (uint)(fVar9 * local_1380 +
                                    fVar8 * (float)local_13c0 + fVar111 * fVar149));
        local_1140._4_4_ =
             (float)(uVar69 ^ (uint)(fVar13 * fStack_137c +
                                    fVar12 * local_13c0._4_4_ + fVar119 * fVar152));
        local_1140._8_4_ =
             (float)(uVar70 ^ (uint)(fVar18 * fStack_1378 +
                                    fVar17 * (float)uStack_13b8 + fVar120 * fVar153));
        local_1140._12_4_ =
             (float)(uVar155 ^
                    (uint)(fVar23 * fStack_1374 + fVar22 * uStack_13b8._4_4_ + fVar121 * fVar154));
        local_1140._16_4_ =
             (float)(uVar157 ^
                    (uint)(fVar28 * fStack_1370 + fVar27 * (float)uStack_13b0 + fVar122 * fVar156));
        local_1140._20_4_ =
             (float)(uVar159 ^
                    (uint)(fVar33 * fStack_136c + fVar32 * uStack_13b0._4_4_ + fVar123 * fVar158));
        local_1140._24_4_ =
             (float)(uVar161 ^
                    (uint)(fVar38 * fStack_1368 + fVar37 * (float)uStack_13a8 + fVar124 * fVar160));
        local_1140._28_4_ = uVar162 ^ (uint)(auVar41._28_4_ + fStack_1264 + 0.0);
        fVar85 = *(float *)(ray + k * 4 + 0x30);
        fVar98 = local_1120._0_4_;
        fVar93 = local_1120._4_4_;
        auVar53._4_4_ = fVar85 * fVar93;
        auVar53._0_4_ = fVar85 * fVar98;
        fVar94 = local_1120._8_4_;
        auVar53._8_4_ = fVar85 * fVar94;
        fVar95 = local_1120._12_4_;
        auVar53._12_4_ = fVar85 * fVar95;
        fVar96 = local_1120._16_4_;
        auVar53._16_4_ = fVar85 * fVar96;
        fVar8 = local_1120._20_4_;
        auVar53._20_4_ = fVar85 * fVar8;
        fVar9 = local_1120._24_4_;
        auVar53._24_4_ = fVar85 * fVar9;
        auVar53._28_4_ = fVar85;
        auVar87 = vcmpps_avx(auVar53,local_1140,1);
        fVar85 = *(float *)(ray + k * 4 + 0x80);
        auVar54._4_4_ = fVar85 * fVar93;
        auVar54._0_4_ = fVar85 * fVar98;
        auVar54._8_4_ = fVar85 * fVar94;
        auVar54._12_4_ = fVar85 * fVar95;
        auVar54._16_4_ = fVar85 * fVar96;
        auVar54._20_4_ = fVar85 * fVar8;
        auVar54._24_4_ = fVar85 * fVar9;
        auVar54._28_4_ = fVar85;
        auVar118 = vcmpps_avx(local_1140,auVar54,2);
        auVar87 = vandps_avx(auVar87,auVar118);
        auVar150 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
        auVar86 = vpand_avx(auVar150,auVar86);
        auVar150 = vpmovzxwd_avx(auVar86);
        auVar102 = vpslld_avx(auVar150,0x1f);
        auVar125 = vpsrad_avx(auVar102,0x1f);
        auVar150 = vpunpckhwd_avx(auVar86,auVar86);
        auVar150 = vpslld_avx(auVar150,0x1f);
        auVar150 = vpsrad_avx(auVar150,0x1f);
        local_1300._16_16_ = auVar150;
        local_1300._0_16_ = auVar125;
        if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_1300 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_1300 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_1300 >> 0x7f,0) != '\0') ||
              (local_1300 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar150 >> 0x3f,0) != '\0') ||
            (local_1300 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar150[0xf] < '\0') {
          local_1180 = auVar142;
          local_1100 = local_1380;
          fStack_10fc = fStack_137c;
          fStack_10f8 = fStack_1378;
          fStack_10f4 = fStack_1374;
          fStack_10f0 = fStack_1370;
          fStack_10ec = fStack_136c;
          fStack_10e8 = fStack_1368;
          uStack_10e4 = auVar103._28_4_;
          local_13c0 = auVar39._0_8_;
          uStack_13b8 = auVar39._8_8_;
          uStack_13b0 = auVar39._16_8_;
          uStack_13a8 = auVar39._24_8_;
          local_10e0 = local_13c0;
          uStack_10d8 = uStack_13b8;
          uStack_10d0 = uStack_13b0;
          uStack_10c8 = uStack_13a8;
          local_1360 = auVar40._0_8_;
          uStack_1358 = auVar40._8_8_;
          uStack_1350 = auVar40._16_8_;
          uStack_1348 = auVar40._24_8_;
          local_10c0 = local_1360;
          uStack_10b8 = uStack_1358;
          uStack_10b0 = uStack_1350;
          uStack_10a8 = uStack_1348;
          local_10a0 = local_1300;
          local_fc0 = local_12c0;
          auVar118 = vrcpps_avx(local_1120);
          fVar85 = auVar118._0_4_;
          fVar92 = auVar118._4_4_;
          auVar55._4_4_ = fVar92 * fVar93;
          auVar55._0_4_ = fVar85 * fVar98;
          fVar98 = auVar118._8_4_;
          auVar55._8_4_ = fVar98 * fVar94;
          fVar93 = auVar118._12_4_;
          auVar55._12_4_ = fVar93 * fVar95;
          fVar94 = auVar118._16_4_;
          auVar55._16_4_ = fVar94 * fVar96;
          fVar95 = auVar118._20_4_;
          auVar55._20_4_ = fVar95 * fVar8;
          fVar96 = auVar118._24_4_;
          auVar55._24_4_ = fVar96 * fVar9;
          auVar55._28_4_ = local_1120._28_4_;
          auVar164._8_4_ = 0x3f800000;
          auVar164._0_8_ = 0x3f8000003f800000;
          auVar164._12_4_ = 0x3f800000;
          auVar164._16_4_ = 0x3f800000;
          auVar164._20_4_ = 0x3f800000;
          auVar164._24_4_ = 0x3f800000;
          auVar164._28_4_ = 0x3f800000;
          auVar103 = vsubps_avx(auVar164,auVar55);
          fVar85 = fVar85 + fVar85 * auVar103._0_4_;
          fVar92 = fVar92 + fVar92 * auVar103._4_4_;
          fVar98 = fVar98 + fVar98 * auVar103._8_4_;
          fVar93 = fVar93 + fVar93 * auVar103._12_4_;
          fVar94 = fVar94 + fVar94 * auVar103._16_4_;
          fVar95 = fVar95 + fVar95 * auVar103._20_4_;
          fVar96 = fVar96 + fVar96 * auVar103._24_4_;
          auVar56._4_4_ = local_1140._4_4_ * fVar92;
          auVar56._0_4_ = local_1140._0_4_ * fVar85;
          auVar56._8_4_ = local_1140._8_4_ * fVar98;
          auVar56._12_4_ = local_1140._12_4_ * fVar93;
          auVar56._16_4_ = local_1140._16_4_ * fVar94;
          auVar56._20_4_ = local_1140._20_4_ * fVar95;
          auVar56._24_4_ = local_1140._24_4_ * fVar96;
          auVar56._28_4_ = auVar118._28_4_;
          local_1040 = auVar56;
          auVar57._4_4_ = auVar142._4_4_ * fVar92;
          auVar57._0_4_ = auVar142._0_4_ * fVar85;
          auVar57._8_4_ = auVar142._8_4_ * fVar98;
          auVar57._12_4_ = auVar142._12_4_ * fVar93;
          auVar57._16_4_ = auVar142._16_4_ * fVar94;
          auVar57._20_4_ = auVar142._20_4_ * fVar95;
          auVar57._24_4_ = auVar142._24_4_ * fVar96;
          auVar57._28_4_ = local_1140._28_4_;
          auVar87 = vminps_avx(auVar57,auVar164);
          auVar58._4_4_ = local_1160._4_4_ * fVar92;
          auVar58._0_4_ = local_1160._0_4_ * fVar85;
          auVar58._8_4_ = local_1160._8_4_ * fVar98;
          auVar58._12_4_ = local_1160._12_4_ * fVar93;
          auVar58._16_4_ = local_1160._16_4_ * fVar94;
          auVar58._20_4_ = local_1160._20_4_ * fVar95;
          auVar58._24_4_ = local_1160._24_4_ * fVar96;
          auVar58._28_4_ = auVar118._28_4_ + auVar103._28_4_;
          auVar118 = vminps_avx(auVar58,auVar164);
          auVar103 = vsubps_avx(auVar164,auVar87);
          auVar39 = vsubps_avx(auVar164,auVar118);
          local_1060 = vblendvps_avx(auVar118,auVar103,local_12c0);
          local_1080 = vblendvps_avx(auVar87,auVar39,local_12c0);
          local_fe0._4_4_ = (float)local_12e0._4_4_ * fVar152;
          local_fe0._0_4_ = (float)local_12e0._0_4_ * fVar149;
          local_fe0._8_4_ = fStack_12d8 * fVar153;
          local_fe0._12_4_ = fStack_12d4 * fVar154;
          local_fe0._16_4_ = fStack_12d0 * fVar156;
          local_fe0._20_4_ = fStack_12cc * fVar158;
          local_fe0._24_4_ = fStack_12c8 * fVar160;
          local_fe0._28_4_ = uStack_12c4;
          local_1020[0] = (float)local_12e0._0_4_ * local_1380;
          local_1020[1] = (float)local_12e0._4_4_ * fStack_137c;
          local_1020[2] = fStack_12d8 * fStack_1378;
          local_1020[3] = fStack_12d4 * fStack_1374;
          fStack_1010 = fStack_12d0 * fStack_1370;
          fStack_100c = fStack_12cc * fStack_136c;
          fStack_1008 = fStack_12c8 * fStack_1368;
          uStack_1004 = local_1080._28_4_;
          local_1000[0] = (float)local_12e0._0_4_ * fVar60;
          local_1000[1] = (float)local_12e0._4_4_ * fVar61;
          local_1000[2] = fStack_12d8 * fVar62;
          local_1000[3] = fStack_12d4 * fVar63;
          fStack_ff0 = fStack_12d0 * fVar64;
          fStack_fec = fStack_12cc * fVar65;
          fStack_fe8 = fStack_12c8 * fVar66;
          uStack_fe4 = auVar87._28_4_;
          auVar150 = vpunpckhwd_avx(auVar86,auVar86);
          auVar150 = vpslld_avx(auVar150,0x1f);
          auVar90._16_16_ = auVar150;
          auVar90._0_16_ = auVar102;
          auVar132._8_4_ = 0x7f800000;
          auVar132._0_8_ = 0x7f8000007f800000;
          auVar132._12_4_ = 0x7f800000;
          auVar132._16_4_ = 0x7f800000;
          auVar132._20_4_ = 0x7f800000;
          auVar132._24_4_ = 0x7f800000;
          auVar132._28_4_ = 0x7f800000;
          auVar87 = vblendvps_avx(auVar132,auVar56,auVar90);
          auVar118 = vshufps_avx(auVar87,auVar87,0xb1);
          auVar118 = vminps_avx(auVar87,auVar118);
          auVar103 = vshufpd_avx(auVar118,auVar118,5);
          auVar118 = vminps_avx(auVar118,auVar103);
          auVar103 = vperm2f128_avx(auVar118,auVar118,1);
          auVar118 = vminps_avx(auVar118,auVar103);
          auVar87 = vcmpps_avx(auVar118,auVar87,0);
          auVar150 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
          auVar86 = vpand_avx(auVar150,auVar86);
          auVar150 = vpmovzxwd_avx(auVar86);
          auVar150 = vpslld_avx(auVar150,0x1f);
          auVar150 = vpsrad_avx(auVar150,0x1f);
          auVar86 = vpunpckhwd_avx(auVar86,auVar86);
          auVar86 = vpslld_avx(auVar86,0x1f);
          auVar86 = vpsrad_avx(auVar86,0x1f);
          auVar91._16_16_ = auVar86;
          auVar91._0_16_ = auVar150;
          if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar91 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar91 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar91 >> 0x7f,0) == '\0') &&
                (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar86 >> 0x3f,0) == '\0') &&
              (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar86[0xf]) {
            auVar91 = local_1300;
          }
          uVar69 = vmovmskps_avx(auVar91);
          uVar77 = 0;
          if (uVar69 != 0) {
            for (; (uVar69 >> uVar77 & 1) == 0; uVar77 = uVar77 + 1) {
            }
          }
          pRVar7 = (context->scene->geometries).items;
          uVar69 = *(uint *)(ray + k * 4 + 0x90);
          while( true ) {
            uVar72 = (ulong)uVar77;
            uVar77 = *(uint *)((long)&local_11a0 + uVar72 * 4);
            if (((pRVar7[uVar77].ptr)->mask & uVar69) != 0) break;
            *(undefined4 *)(local_1300 + uVar72 * 4) = 0;
            if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_1300 >> 0x7f,0) == '\0') &&
                  (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_1300 >> 0xbf,0) == '\0') &&
                (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_1300[0x1f]) goto LAB_00ef6b3f;
            auVar87 = vblendvps_avx(auVar132,auVar56,local_1300);
            auVar118 = vshufps_avx(auVar87,auVar87,0xb1);
            auVar118 = vminps_avx(auVar87,auVar118);
            auVar103 = vshufpd_avx(auVar118,auVar118,5);
            auVar118 = vminps_avx(auVar118,auVar103);
            auVar103 = vperm2f128_avx(auVar118,auVar118,1);
            auVar118 = vminps_avx(auVar118,auVar103);
            auVar118 = vcmpps_avx(auVar87,auVar118,0);
            auVar103 = local_1300 & auVar118;
            auVar87 = local_1300;
            if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar103 >> 0x7f,0) != '\0') ||
                  (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar103 >> 0xbf,0) != '\0') ||
                (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar103[0x1f] < '\0') {
              auVar87 = vandps_avx(auVar118,local_1300);
            }
            uVar70 = vmovmskps_avx(auVar87);
            uVar77 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> uVar77 & 1) == 0; uVar77 = uVar77 + 1) {
              }
            }
          }
          uVar2 = *(undefined4 *)(local_1080 + uVar72 * 4);
          uVar6 = *(undefined4 *)(local_1060 + uVar72 * 4);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1040 + uVar72 * 4);
          *(float *)(ray + k * 4 + 0xc0) = local_1020[uVar72];
          *(float *)(ray + k * 4 + 0xd0) = local_1000[uVar72];
          *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_fe0 + uVar72 * 4);
          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar2;
          *(undefined4 *)(ray + k * 4 + 0x100) = uVar6;
          *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_11c0 + uVar72 * 4);
          *(uint *)(ray + k * 4 + 0x120) = uVar77;
          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
        }
      }
LAB_00ef6b3f:
    }
    uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar165 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }